

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

void __thiscall
libtorrent::aux::link::insert<libtorrent::aux::torrent>
          (link *this,vector<libtorrent::aux::torrent_*> *list,torrent *self)

{
  iterator __position;
  pointer pptVar1;
  torrent *local_18;
  
  if (this->index < 0) {
    __position._M_current =
         (list->
         super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>).
         super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (list->super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
        ).
        super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_18 = self;
      ::std::vector<libtorrent::aux::torrent*,std::allocator<libtorrent::aux::torrent*>>::
      _M_realloc_insert<libtorrent::aux::torrent*const&>
                ((vector<libtorrent::aux::torrent*,std::allocator<libtorrent::aux::torrent*>> *)list
                 ,__position,&local_18);
      pptVar1 = (list->
                super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                ).
                super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      *__position._M_current = self;
      pptVar1 = (list->
                super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                ).
                super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                ._M_impl.super__Vector_impl_data._M_finish + 1;
      (list->super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>).
      super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = pptVar1;
    }
    this->index = (int)((ulong)((long)pptVar1 -
                               (long)(list->
                                     super_vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                     ).
                                     super__Vector_base<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  }
  return;
}

Assistant:

void insert(aux::vector<T*>& list, T* self)
		{
			if (index >= 0) return;
			TORRENT_ASSERT(index == -1);
			list.push_back(self);
			index = int(list.size()) - 1;
		}